

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::url_seed_alert::url_seed_alert
          (url_seed_alert *this,stack_allocator *alloc,torrent_handle *h,string_view u,error_code *e
          )

{
  error_category *peVar1;
  bool bVar2;
  undefined3 uVar3;
  allocation_slot aVar4;
  char *local_58;
  size_t local_50;
  string local_48;
  
  local_50 = u.len_;
  local_58 = u.ptr_;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__url_seed_alert_00431e70;
  bVar2 = e->failed_;
  uVar3 = *(undefined3 *)&e->field_0x5;
  peVar1 = e->cat_;
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  aVar4 = aux::stack_allocator::copy_string(alloc,u);
  (this->m_url_idx).m_idx = aVar4.m_idx;
  (this->m_msg_idx).m_idx = -1;
  boost::basic_string_view::operator_cast_to_string(&this->url,(basic_string_view *)&local_58);
  (*e->cat_->_vptr_error_category[4])(&local_48,e->cat_,(ulong)(uint)e->val_);
  convert_from_native(&this->msg,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

url_seed_alert::url_seed_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, string_view u, error_code const& e)
		: torrent_alert(alloc, h)
		, error(e)
		, m_url_idx(alloc.copy_string(u))
		, m_msg_idx()
#if TORRENT_ABI_VERSION == 1
		, url(u)
		, msg(convert_from_native(e.message()))
#endif
	{}